

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoAtomicRmw<unsigned_int,unsigned_int>
          (Thread *this,BinopFunc<unsigned_int,_unsigned_int> *f,Instr instr,Ptr *out_trap)

{
  Store *pSVar1;
  bool bVar2;
  RefVec *this_00;
  const_reference pvVar3;
  Memory *this_01;
  string local_98;
  Ptr local_78;
  Enum local_60;
  uint local_5c;
  u64 uStack_58;
  uint old;
  u64 offset;
  Ref RStack_48;
  uint val;
  undefined1 local_40 [8];
  Ptr memory;
  Ptr *out_trap_local;
  BinopFunc<unsigned_int,_unsigned_int> *f_local;
  Thread *this_local;
  
  pSVar1 = this->store_;
  memory.root_index_ = (Index)out_trap;
  out_trap_local = (Ptr *)f;
  f_local = (BinopFunc<unsigned_int,_unsigned_int> *)this;
  this_00 = Instance::memories(this->inst_);
  pvVar3 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                     (this_00,(ulong)instr.field_2.imm_u32);
  RStack_48.index = pvVar3->index;
  RefPtr<wabt::interp::Memory>::RefPtr((RefPtr<wabt::interp::Memory> *)local_40,pSVar1,RStack_48);
  offset._4_4_ = Pop<unsigned_int>(this);
  uStack_58 = PopPtr(this,(Ptr *)local_40);
  this_01 = RefPtr<wabt::interp::Memory>::operator->((RefPtr<wabt::interp::Memory> *)local_40);
  local_60 = (Enum)Memory::AtomicRmw<unsigned_int,unsigned_int(*&)(unsigned_int,unsigned_int)>
                             (this_01,uStack_58,(ulong)instr.field_2.imm_u32x2.snd,offset._4_4_,
                              (BinopFunc<unsigned_int,_unsigned_int> **)&out_trap_local,&local_5c);
  bVar2 = Failed((Result)local_60);
  if (bVar2) {
    pSVar1 = this->store_;
    StringPrintf_abi_cxx11_
              (&local_98,"invalid atomic access at %lu+%u",uStack_58,
               (ulong)instr.field_2.imm_u32x2.snd);
    Trap::New(&local_78,pSVar1,&local_98,&this->frames_);
    RefPtr<wabt::interp::Trap>::operator=
              ((RefPtr<wabt::interp::Trap> *)memory.root_index_,&local_78);
    this_local._4_4_ = Trap;
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
  }
  else {
    Push<unsigned_int>(this,local_5c);
    this_local._4_4_ = Ok;
  }
  RefPtr<wabt::interp::Memory>::~RefPtr((RefPtr<wabt::interp::Memory> *)local_40);
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoAtomicRmw(BinopFunc<T, T> f,
                              Instr instr,
                              Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2.fst]};
  T val = static_cast<T>(Pop<R>());
  u64 offset = PopPtr(memory);
  T old;
  TRAP_IF(Failed(memory->AtomicRmw(offset, instr.imm_u32x2.snd, val, f, &old)),
          StringPrintf("invalid atomic access at %" PRIaddress "+%u", offset,
                       instr.imm_u32x2.snd));
  Push(static_cast<R>(old));
  return RunResult::Ok;
}